

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_stream_parser.cc
# Opt level: O2

Status * __thiscall
google::protobuf::util::converter::JsonStreamParser::IncrementRecursionDepth
          (Status *__return_storage_ptr__,JsonStreamParser *this,StringPiece key)

{
  int iVar1;
  stringpiece_ssize_type sVar2;
  AlphaNum *in_R8;
  StringPiece error_message;
  char *local_d0;
  undefined8 local_c8;
  AlphaNum local_a0;
  AlphaNum local_70;
  string local_40;
  
  local_a0.piece_size_ = key.length_;
  local_a0.piece_data_ = key.ptr_;
  iVar1 = this->recursion_depth_;
  this->recursion_depth_ = iVar1 + 1;
  if (iVar1 < this->max_recursion_depth_) {
    Status::Status(__return_storage_ptr__);
  }
  else {
    local_d0 = "Message too deep. Max recursion depth reached for key \'";
    local_c8 = 0x37;
    local_70.piece_data_ = "\'";
    local_70.piece_size_ = 1;
    StrCat_abi_cxx11_(&local_40,(protobuf *)&local_d0,&local_a0,&local_70,in_R8);
    sVar2 = StringPiece::CheckedSsizeTFromSizeT(local_40._M_string_length);
    error_message.length_ = sVar2;
    error_message.ptr_ = local_40._M_dataplus._M_p;
    Status::Status(__return_storage_ptr__,INVALID_ARGUMENT,error_message);
    std::__cxx11::string::~string((string *)&local_40);
  }
  return __return_storage_ptr__;
}

Assistant:

util::Status JsonStreamParser::IncrementRecursionDepth(
    StringPiece key) const {
  if (++recursion_depth_ > max_recursion_depth_) {
    return Status(
        util::error::INVALID_ARGUMENT,
        StrCat("Message too deep. Max recursion depth reached for key '",
                     key, "'"));
  }
  return util::Status();
}